

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessian.cpp
# Opt level: O2

bool __thiscall HighsHessian::operator==(HighsHessian *this,HighsHessian *hessian)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  
  iVar1 = hessian->dim_;
  iVar2 = this->dim_;
  bVar3 = std::operator==(&this->start_,&hessian->start_);
  bVar4 = std::operator==(&this->index_,&hessian->index_);
  bVar5 = std::operator==(&this->value_,&hessian->value_);
  return (bVar5 && (bVar4 && bVar3)) && iVar2 == iVar1;
}

Assistant:

bool HighsHessian::operator==(const HighsHessian& hessian) const {
  bool equal = true;
  equal = this->dim_ == hessian.dim_ && equal;
  equal = this->start_ == hessian.start_ && equal;
  equal = this->index_ == hessian.index_ && equal;
  equal = this->value_ == hessian.value_ && equal;
  return equal;
}